

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_type.c
# Opt level: O3

void apx_dataType_destroy(apx_dataType_t *self)

{
  if (self != (apx_dataType_t *)0x0) {
    if (self->name != (char *)0x0) {
      free(self->name);
      self->name = (char *)0x0;
    }
    apx_dataSignature_destroy(&self->data_signature);
    if (self->attributes != (apx_typeAttributes_t *)0x0) {
      apx_typeAttributes_delete(self->attributes);
      self->attributes = (apx_typeAttributes_t *)0x0;
    }
  }
  return;
}

Assistant:

void apx_dataType_destroy(apx_dataType_t* self)
{
   if ( self !=0 )
   {
      if (self->name != NULL)
      {
         free(self->name);
         self->name = NULL;
      }
      apx_dataSignature_destroy(&self->data_signature);
      if (self->attributes != NULL)
      {
         apx_typeAttributes_delete(self->attributes);
         self->attributes = NULL;
      }
   }
}